

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_tidy.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  char *pcVar3;
  char **ppcVar4;
  char cVar5;
  bool bVar6;
  
  if (1 < argc) {
    uVar2 = 2;
    ppcVar4 = argv;
    do {
      ppcVar4 = ppcVar4 + 1;
      pcVar3 = *ppcVar4;
      cVar5 = *pcVar3;
      if (((cVar5 == '-') && (pcVar3[1] == 'p')) && (pcVar3[2] == '\0')) {
        while( true ) {
          if ((uint)argc <= uVar2) {
            return 0;
          }
          pcVar3 = argv[uVar2];
          if (((*pcVar3 == '-') && (pcVar3[1] == '-')) && (pcVar3[2] == '\0')) break;
          uVar2 = uVar2 + 1;
        }
        main_cold_4();
        return 1;
      }
      iVar1 = strcmp(pcVar3,"-bad");
      if (iVar1 == 0) {
        main_cold_3();
        return 1;
      }
      iVar1 = strncmp(pcVar3,"--export-fixes=",0xf);
      if (iVar1 == 0) {
        __stream = fopen(pcVar3 + 0xf,"w");
        if (__stream == (FILE *)0x0) {
          main_cold_2();
          return 1;
        }
        fclose(__stream);
        pcVar3 = *ppcVar4;
        cVar5 = *pcVar3;
      }
      if (cVar5 != '-') {
        fprintf(_stdout,"%s:0:0: warning: message [checker]\n",pcVar3);
        break;
      }
      bVar6 = uVar2 != (uint)argc;
      uVar2 = uVar2 + 1;
    } while (bVar6);
  }
  main_cold_1();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  FILE* f;
  int i;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "-p") == 0) {
      // Ensure compile commands were not appended after the source file
      for (++i; i < argc; ++i) {
        if (strcmp(argv[i], "--") == 0) {
          fprintf(stderr, "Command line arguments unexpectedly appended\n");
          return 1;
        }
      }
      return 0;
    }
    if (strcmp(argv[i], "-bad") == 0) {
      fprintf(stdout, "stdout from bad command line arg '-bad'\n");
      fprintf(stderr, "stderr from bad command line arg '-bad'\n");
      return 1;
    }
    if (strncmp(argv[i], "--export-fixes=", 15) == 0) {
      f = fopen(argv[i] + 15, "w");
      if (!f) {
        fprintf(stderr, "Error opening %s for writing\n", argv[i] + 15);
        return 1;
      }
      fclose(f);
    }
    if (argv[i][0] != '-') {
      fprintf(stdout, "%s:0:0: warning: message [checker]\n", argv[i]);
      break;
    }
  }
  fprintf(stderr, "1 warning generated.\n");
  return 0;
}